

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat_end_matcher.hpp
# Opt level: O3

bool __thiscall
boost::xpressive::detail::repeat_end_matcher<mpl_::bool_<false>>::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (repeat_end_matcher<mpl_::bool_<false>> *this,long state,long *next)

{
  char cVar1;
  uint uVar2;
  uint *puVar3;
  
  puVar3 = (uint *)(*(long *)(state + 8) + (long)*(int *)this * 0x28 + 0x14);
  uVar2 = *puVar3;
  if (*(uint *)(this + 4) <= uVar2) {
    cVar1 = (**(code **)(*next + 0x10))(next,state);
    if (cVar1 != '\0') {
      return true;
    }
    uVar2 = *puVar3;
  }
  if (uVar2 < *(uint *)(this + 8)) {
    *puVar3 = uVar2 + 1;
    cVar1 = (**(code **)(**(long **)(this + 0x10) + 0x10))(*(long **)(this + 0x10),state);
    if (cVar1 != '\0') {
      return true;
    }
    *puVar3 = *puVar3 - 1;
  }
  return false;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, mpl::false_) const
        {
            sub_match_impl<BidiIter> &br = state.sub_match(this->mark_number_);

            if(this->min_ <= br.repeat_count_)
            {
                if(next.skip_match(state))
                {
                    return true;
                }
            }

            if(this->max_ > br.repeat_count_)
            {
                ++br.repeat_count_;
                if(next.top_match(state, this->back_))
                {
                    return true;
                }
                --br.repeat_count_;
            }

            return false;
        }